

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int CollectionCacheInstallRecord(unqlite_col *pCol,jx9_int64 nId,jx9_value *pValue)

{
  sxu32 sVar1;
  uint uVar2;
  unqlite_col_record *puVar3;
  unqlite_col_record **pSrc;
  uint local_4c;
  sxu32 n;
  unqlite_col_record **apNew;
  unqlite_col_record *pEntry;
  sxu32 nNewSize;
  sxu32 iBucket;
  unqlite_col_record *pRecord;
  jx9_value *pValue_local;
  jx9_int64 nId_local;
  unqlite_col *pCol_local;
  
  puVar3 = CollectionCacheFetchRecord(pCol,nId);
  if (puVar3 == (unqlite_col_record *)0x0) {
    puVar3 = (unqlite_col_record *)SyMemBackendPoolAlloc(&pCol->pVm->sAlloc,0x70);
    if (puVar3 == (unqlite_col_record *)0x0) {
      pCol_local._4_4_ = -1;
    }
    else {
      SyZero(puVar3,0x70);
      jx9MemObjInit(pCol->pVm->pJx9Vm,&puVar3->sValue);
      jx9MemObjStore(pValue,&puVar3->sValue);
      puVar3->nId = nId;
      puVar3->pCol = pCol;
      uVar2 = (uint)nId & pCol->nRecSize - 1;
      puVar3->pNextCol = pCol->apRecord[uVar2];
      if (pCol->apRecord[uVar2] != (unqlite_col_record *)0x0) {
        pCol->apRecord[uVar2]->pPrevCol = puVar3;
      }
      pCol->apRecord[uVar2] = puVar3;
      if (pCol->pList == (unqlite_col_record *)0x0) {
        pCol->pList = puVar3;
      }
      else {
        puVar3->pNext = pCol->pList;
        pCol->pList->pPrev = puVar3;
        pCol->pList = puVar3;
      }
      pCol->nRec = pCol->nRec + 1;
      if ((pCol->nRecSize * 3 <= pCol->nRec) && (pCol->nRec < 100000)) {
        sVar1 = pCol->nRecSize;
        pSrc = (unqlite_col_record **)SyMemBackendAlloc(&pCol->pVm->sAlloc,sVar1 << 4);
        if (pSrc != (unqlite_col_record **)0x0) {
          SyZero(pSrc,sVar1 << 4);
          local_4c = 0;
          apNew = (unqlite_col_record **)pCol->pList;
          for (; local_4c < pCol->nRec; local_4c = local_4c + 1) {
            apNew[0xb] = (unqlite_col_record *)0x0;
            apNew[10] = (unqlite_col_record *)0x0;
            uVar2 = (uint)apNew[1] & sVar1 * 2 - 1;
            apNew[10] = pSrc[uVar2];
            if (pSrc[uVar2] != (unqlite_col_record *)0x0) {
              pSrc[uVar2]->pPrevCol = (unqlite_col_record *)apNew;
            }
            pSrc[uVar2] = (unqlite_col_record *)apNew;
            apNew = (unqlite_col_record **)apNew[0xc];
          }
          SyMemBackendFree(&pCol->pVm->sAlloc,pCol->apRecord);
          pCol->apRecord = pSrc;
          pCol->nRecSize = sVar1 * 2;
        }
      }
      pCol_local._4_4_ = 0;
    }
  }
  else {
    jx9MemObjStore(pValue,&puVar3->sValue);
    pCol_local._4_4_ = 0;
  }
  return pCol_local._4_4_;
}

Assistant:

static int CollectionCacheInstallRecord(
	unqlite_col *pCol, /* Target collection */
	jx9_int64 nId,     /* Unique record ID */
	jx9_value *pValue  /* JSON value */
	)
{
	unqlite_col_record *pRecord;
	sxu32 iBucket;
	/* Fetch the record first */
	pRecord = CollectionCacheFetchRecord(pCol,nId);
	if( pRecord ){
		/* Record already installed, overwrite its old value  */
		jx9MemObjStore(pValue,&pRecord->sValue);
		return UNQLITE_OK;
	}
	/* Allocate a new instance */
	pRecord = (unqlite_col_record *)SyMemBackendPoolAlloc(&pCol->pVm->sAlloc,sizeof(unqlite_col_record));
	if( pRecord == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pRecord,sizeof(unqlite_col_record));
	/* Fill in the structure */
	jx9MemObjInit(pCol->pVm->pJx9Vm,&pRecord->sValue);
	jx9MemObjStore(pValue,&pRecord->sValue);
	pRecord->nId = nId;
	pRecord->pCol = pCol;
	/* Install in the corresponding bucket */
	iBucket = COL_RECORD_HASH(nId) & (pCol->nRecSize - 1);
	pRecord->pNextCol = pCol->apRecord[iBucket];
	if( pCol->apRecord[iBucket] ){
		pCol->apRecord[iBucket]->pPrevCol = pRecord;
	}
	pCol->apRecord[iBucket] = pRecord;
	/* Link */
	MACRO_LD_PUSH(pCol->pList,pRecord);
	pCol->nRec++;
	if( (pCol->nRec >= pCol->nRecSize * 3) && pCol->nRec < 100000 ){
		/* Allocate a new larger table */
		sxu32 nNewSize = pCol->nRecSize << 1;
		unqlite_col_record *pEntry;
		unqlite_col_record **apNew;
		sxu32 n;
		
		apNew = (unqlite_col_record **)SyMemBackendAlloc(&pCol->pVm->sAlloc, nNewSize * sizeof(unqlite_col_record *));
		if( apNew ){
			/* Zero the new table */
			SyZero((void *)apNew, nNewSize * sizeof(unqlite_col_record *));
			/* Rehash all entries */
			n = 0;
			pEntry = pCol->pList;
			for(;;){
				/* Loop one */
				if( n >= pCol->nRec ){
					break;
				}
				pEntry->pNextCol = pEntry->pPrevCol = 0;
				/* Install in the new bucket */
				iBucket = COL_RECORD_HASH(pEntry->nId) & (nNewSize - 1);
				pEntry->pNextCol = apNew[iBucket];
				if( apNew[iBucket]  ){
					apNew[iBucket]->pPrevCol = pEntry;
				}
				apNew[iBucket] = pEntry;
				/* Point to the next entry */
				pEntry = pEntry->pNext;
				n++;
			}
			/* Release the old table and reflect the change */
			SyMemBackendFree(&pCol->pVm->sAlloc,(void *)pCol->apRecord);
			pCol->apRecord = apNew;
			pCol->nRecSize = nNewSize;
		}
	}
	/* All done */
	return UNQLITE_OK;
}